

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O2

void __thiscall
FIX::MessageCracker::crack
          (MessageCracker *this,Message *message,SessionID *sessionID,BeginString *beginString)

{
  bool bVar1;
  long lVar2;
  string *__lhs;
  ApplVerID applVerID;
  FieldBase local_d0;
  FieldBase local_78;
  
  __lhs = &(beginString->super_StringField).super_FieldBase.m_string;
  bVar1 = std::operator==(__lhs,"FIX.4.0");
  if (bVar1) {
    FIX40::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
    return;
  }
  bVar1 = std::operator==(__lhs,"FIX.4.1");
  if (bVar1) {
    FIX41::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
    return;
  }
  bVar1 = std::operator==(__lhs,"FIX.4.2");
  if (bVar1) {
    FIX42::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
    return;
  }
  bVar1 = std::operator==(__lhs,"FIX.4.3");
  if (bVar1) {
    FIX43::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
    return;
  }
  bVar1 = std::operator==(__lhs,"FIX.4.4");
  if (bVar1) {
    FIX44::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
    return;
  }
  bVar1 = std::operator==(__lhs,BeginString_FIXT11);
  if (bVar1) {
    bVar1 = Message::isAdmin(message);
    if (bVar1) {
      FIXT11::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
      return;
    }
    ApplVerID::ApplVerID((ApplVerID *)&local_d0);
    bVar1 = FieldMap::getFieldIfSet((FieldMap *)(message + 0x70),&local_d0);
    if (!bVar1) {
      lVar2 = FIX::Session::lookupSession(sessionID);
      ApplVerID::ApplVerID((ApplVerID *)&local_78,(STRING *)(lVar2 + 0x200));
      FieldBase::operator=(&local_d0,&local_78);
      FieldBase::~FieldBase(&local_78);
    }
    crack(this,message,sessionID,(ApplVerID *)&local_d0);
    FieldBase::~FieldBase(&local_d0);
  }
  return;
}

Assistant:

void crack(const Message &message, const SessionID &sessionID, const BeginString &beginString) {
    if (beginString == BeginString_FIX40) {
      ((FIX40::MessageCracker &)(*this)).crack((const FIX40::Message &)message, sessionID);
    } else if (beginString == BeginString_FIX41) {
      ((FIX41::MessageCracker &)(*this)).crack((const FIX41::Message &)message, sessionID);
    } else if (beginString == BeginString_FIX42) {
      ((FIX42::MessageCracker &)(*this)).crack((const FIX42::Message &)message, sessionID);
    } else if (beginString == BeginString_FIX43) {
      ((FIX43::MessageCracker &)(*this)).crack((const FIX43::Message &)message, sessionID);
    } else if (beginString == BeginString_FIX44) {
      ((FIX44::MessageCracker &)(*this)).crack((const FIX44::Message &)message, sessionID);
    } else if (beginString == BeginString_FIXT11) {
      if (message.isAdmin()) {
        ((FIXT11::MessageCracker &)(*this)).crack((const FIXT11::Message &)message, sessionID);
      } else {
        ApplVerID applVerID;
        if (!message.getHeader().getFieldIfSet(applVerID)) {
          Session *pSession = Session::lookupSession(sessionID);
          applVerID = pSession->getSenderDefaultApplVerID();
        }

        crack(message, sessionID, applVerID);
      }
    }
  }